

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

void __thiscall ON_UuidList::PurgeHelper(ON_UuidList *this)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  bool bVar3;
  int iVar4;
  ON_UUID_struct *pOVar5;
  ON_UUID_struct *pOVar6;
  int local_18;
  int local_14;
  int i;
  int count;
  ON_UuidList *this_local;
  
  if ((this->m_removed_count <= (this->super_ON_SimpleArray<ON_UUID_struct>).m_count) &&
     (0 < this->m_removed_count)) {
    this->m_removed_count = 0;
    local_14 = 0;
    for (local_18 = 0; local_18 < (this->super_ON_SimpleArray<ON_UUID_struct>).m_count;
        local_18 = local_18 + 1) {
      bVar3 = ::operator==(&ON_max_uuid,(this->super_ON_SimpleArray<ON_UUID_struct>).m_a + local_18)
      ;
      if (!bVar3) {
        if (local_14 < local_18) {
          pOVar6 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_a + local_18;
          pOVar5 = (this->super_ON_SimpleArray<ON_UUID_struct>).m_a + local_14;
          uVar1 = pOVar6->Data2;
          uVar2 = pOVar6->Data3;
          pOVar5->Data1 = pOVar6->Data1;
          pOVar5->Data2 = uVar1;
          pOVar5->Data3 = uVar2;
          *(undefined8 *)pOVar5->Data4 = *(undefined8 *)pOVar6->Data4;
        }
        local_14 = local_14 + 1;
      }
    }
    if (local_14 < (this->super_ON_SimpleArray<ON_UUID_struct>).m_count) {
      (this->super_ON_SimpleArray<ON_UUID_struct>).m_count = local_14;
      if (local_14 < 1) {
        this->m_sorted_count = 0;
      }
      else {
        this->m_sorted_count = 1;
        while ((this->m_sorted_count < (this->super_ON_SimpleArray<ON_UUID_struct>).m_count &&
               (iVar4 = ON_UuidCompare((this->super_ON_SimpleArray<ON_UUID_struct>).m_a +
                                       (this->m_sorted_count + -1),
                                       (this->super_ON_SimpleArray<ON_UUID_struct>).m_a +
                                       this->m_sorted_count), iVar4 < 1))) {
          this->m_sorted_count = this->m_sorted_count + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void ON_UuidList::PurgeHelper()
{
  if ( m_removed_count <= m_count && m_removed_count > 0 )
  {
    m_removed_count = 0;

    // purge removed ids
    int count = 0;
    for ( int i = 0; i < m_count; i++ )
    {
      if ( ON_max_uuid == m_a[i] )
        continue;

      if ( i > count )
        m_a[count] = m_a[i];

      count++;
    }

    if ( count < m_count )
    {
      m_count = count;
      if ( count > 0 )
      {
        // set m_sorted_count
        for ( m_sorted_count = 1; m_sorted_count < m_count; m_sorted_count++ )
        {
          if ( ON_UuidCompare(m_a[m_sorted_count-1],m_a[m_sorted_count])> 0 )
            break;
        }
      }
      else
      {
        m_sorted_count = 0;
      }
    }
  }
}